

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

LinearFunctionalConstraint * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExtractLinAndExprArgs
          (LinearFunctionalConstraint *__return_storage_ptr__,
          Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,LinTerms *ltin,LinTerms *ltout)

{
  size_ty sVar1;
  size_ty sVar2;
  LinTerms lt_in_expr;
  inline_storage<double,_6U> *local_180;
  ulong local_178;
  inline_storage<double,_6U> local_168;
  inline_storage<int,_6U> *local_138;
  ulong local_130;
  size_ty local_128;
  inline_storage<int,_6U> local_120;
  AffineExpr local_108;
  LinTerms local_88;
  
  SplitLinTerms(&local_88,this,ltin,ltout);
  sVar1 = local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_180 = &local_168;
    local_178 = 6;
    if (local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_180,
             local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_180 = (inline_storage<double,_6U> *)
                local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_178 = local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  }
  sVar2 = local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  if (local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_138 = &local_120;
    local_130 = 6;
    if (local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_138,
             local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_138 = (inline_storage<int,_6U> *)
                local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_130 = local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  }
  local_128 = sVar2;
  if (local_178 < 7) {
    local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.m_storage;
    local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (sVar1 != 0) {
      memcpy(local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
             m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_180,
             sVar1 * 8);
    }
  }
  else {
    local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_180;
    local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_178;
    local_178 = 6;
    local_180 = &local_168;
  }
  if (local_130 < 7) {
    local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.m_storage;
    local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_128 != 0) {
      memcpy(local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,local_138,local_128 * 4);
    }
  }
  else {
    local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_138;
    local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_130;
    local_130 = 6;
    local_128 = 0;
    local_138 = &local_120;
  }
  local_108.constant_term_ = 0.0;
  LinearFunctionalConstraint::LinearFunctionalConstraint(__return_storage_ptr__,&local_108);
  if (6 < local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_108.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_108.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_108.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_108.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_130) {
    operator_delete(local_138,local_130 << 2);
  }
  if (6 < local_178) {
    operator_delete(local_180,local_178 << 3);
  }
  if (6 < local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_88.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_88.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

LinearFunctionalConstraint ExtractLinAndExprArgs(
      const LinTerms& ltin,
      LinTerms& ltout) {
    LinTerms lt_in_expr = SplitLinTerms(ltin.GetLinTerms(), ltout);
    return {{std::move(lt_in_expr), 0.0}};
  }